

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O3

uint64_t murmurhash(void *key,uint64_t len,uint64_t seed)

{
  void *pvVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = len * -0x395b586ca42e166b ^ seed;
  uVar4 = len & 0xfffffffffffffff8;
  pvVar1 = (void *)((long)key + uVar4);
  pvVar3 = key;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      uVar6 = *(long *)((long)key + uVar5) * -0x395b586ca42e166b;
      uVar2 = (uVar2 ^ (uVar6 >> 0x2f ^ uVar6) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
      uVar5 = uVar5 + 8;
      pvVar3 = pvVar1;
    } while (uVar4 != uVar5);
  }
  uVar4 = len & 7;
  if (uVar4 != 0) {
    if (pvVar3 == (void *)((long)pvVar1 + uVar4)) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      uVar5 = 0;
      do {
        uVar5 = uVar5 << 8 | (ulong)*(byte *)((long)pvVar1 + uVar6);
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    uVar2 = (uVar5 ^ uVar2) * -0x395b586ca42e166b;
  }
  uVar2 = (uVar2 >> 0x2f ^ uVar2) * -0x395b586ca42e166b;
  return uVar2 >> 0x2f ^ uVar2;
}

Assistant:

inline uint64_t murmurhash(const void *key, uint64_t len, uint64_t seed) noexcept
{
    const uint64_t m = 0xc6a4a7935bd1e995ULL;
    const int r = 47;

    uint64_t h = seed ^ (len * m);

    const unsigned char *data = reinterpret_cast<const unsigned char *>(key);
    const unsigned char *end = data + (len & ~7ul);

    while (data != end) {
        uint64_t k;
        memcpy(&k, data, sizeof(uint64_t));

        k *= m;
        k ^= k >> r;
        k *= m;

        h ^= k;
        h *= m;

        data += 8;
    }

    len &= 7;
    if (len) {
        // handle the last few bytes of input
        size_t k = 0;
        end += len;

        while (data != end) {
            k <<= 8;
            k |= *data;
            ++data;
        }
        h ^= k;
        h *= m;
    }

    h ^= h >> r;
    h *= m;
    h ^= h >> r;

    return h;
}